

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall anon_unknown.dwarf_145302::SymlinkTool::createCommand(SymlinkTool *this,StringRef name)

{
  byte bVar1;
  pointer pSVar2;
  unique_ptr<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>_>
  local_30;
  type res;
  SymlinkTool *this_local;
  StringRef name_local;
  
  this_local = (SymlinkTool *)name.Length;
  res._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::SymlinkCommand_*,_std::default_delete<(anonymous_namespace)::SymlinkCommand>_>
  .super__Head_base<0UL,_(anonymous_namespace)::SymlinkCommand_*,_false>._M_head_impl =
       (__uniq_ptr_data<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>,_true,_true>
        )(__uniq_ptr_data<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>,_true,_true>
          )name.Data;
  name_local.Length = (size_t)this;
  llvm::make_unique<(anonymous_namespace)::SymlinkCommand,llvm::StringRef&>
            ((llvm *)&local_30,(StringRef *)&this_local);
  bVar1 = *(byte *)((long)name.Data + 0x28);
  pSVar2 = std::
           unique_ptr<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>_>
           ::operator->(&local_30);
  (pSVar2->super_Command).repairViaOwnershipAnalysis = (bool)(bVar1 & 1);
  std::unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
  ::
  unique_ptr<(anonymous_namespace)::SymlinkCommand,std::default_delete<(anonymous_namespace)::SymlinkCommand>,void>
            ((unique_ptr<llbuild::buildsystem::Command,std::default_delete<llbuild::buildsystem::Command>>
              *)this,&local_30);
  std::
  unique_ptr<(anonymous_namespace)::SymlinkCommand,_std::default_delete<(anonymous_namespace)::SymlinkCommand>_>
  ::~unique_ptr(&local_30);
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(StringRef name) override {
    auto res = llvm::make_unique<SymlinkCommand>(name);
    res->repairViaOwnershipAnalysis = repairViaOwnershipAnalysis;
    return res;
  }